

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fPrerequisiteTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::gles2::Functional::ClearColorCase::iterate(ClearColorCase *this)

{
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  GLenum err;
  int iVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  deRandom rnd;
  deRandom local_40;
  
  uVar6 = (ulong)(uint)this->m_curIter;
  if (uVar6 < 5) {
    fVar7 = *(float *)(&DAT_005af828 + uVar6 * 4);
    fVar8 = *(float *)(&DAT_005af83c + uVar6 * 4);
    fVar9 = *(float *)(&DAT_005af850 + uVar6 * 4);
    fVar10 = 255.0;
  }
  else {
    dVar1 = deInt32Hash(this->m_curIter);
    deRandom_init(&local_40,dVar1);
    dVar1 = deRandom_getUint32(&local_40);
    dVar2 = deRandom_getUint32(&local_40);
    dVar3 = deRandom_getUint32(&local_40);
    dVar4 = deRandom_getUint32(&local_40);
    fVar7 = (float)(dVar1 & 0xff);
    fVar8 = (float)(dVar2 & 0xff);
    fVar9 = (float)(dVar3 & 0xff);
    fVar10 = (float)(dVar4 & 0xff);
  }
  glwClearColor(fVar7 / 255.0,fVar8 / 255.0,fVar9 / 255.0,fVar10 / 255.0);
  glwClear(0x4000);
  err = glwGetError();
  glu::checkError(err,"CLES2 ClearColor failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fPrerequisiteTests.cpp"
                  ,0x90);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  iVar5 = this->m_curIter + 1;
  this->m_curIter = iVar5;
  return (IterateResult)(iVar5 < this->m_numIters);
}

Assistant:

TestCase::IterateResult ClearColorCase::iterate (void)
{
	int r = 0;
	int g = 0;
	int b = 0;
	int a = 255;

	switch (m_curIter)
	{
		case 0:
			// Black, skip
			break;
		case 1:
			r = 255;
			g = 255;
			b = 255;
			break;
		case 2:
			r = 255;
			break;
		case 3:
			g = 255;
			break;
		case 4:
			b = 255;
			break;
		default:
			deRandom rnd;
			deRandom_init(&rnd, deInt32Hash(m_curIter));
			r = (int)(deRandom_getUint32(&rnd) & 0xFF);
			g = (int)(deRandom_getUint32(&rnd) & 0xFF);
			b = (int)(deRandom_getUint32(&rnd) & 0xFF);
			a = (int)(deRandom_getUint32(&rnd) & 0xFF);
			break;

	};

	glClearColor(float(r)/255.0f, float(g)/255.0f, float(b)/255.0f, float(a)/255.0f);
	glClear(GL_COLOR_BUFFER_BIT);

	GLU_CHECK_MSG("CLES2 ClearColor failed.");

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return (++m_curIter < m_numIters) ? CONTINUE : STOP;
}